

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ipc::HostImpl::ExposedService::ExposedService
          (ExposedService *this,ExposedService *param_1)

{
  ExposedService *param_1_local;
  ExposedService *this_local;
  
  this->id = param_1->id;
  ::std::__cxx11::string::string((string *)&this->name,(string *)&param_1->name);
  std::unique_ptr<perfetto::ipc::Service,_std::default_delete<perfetto::ipc::Service>_>::unique_ptr
            (&this->instance,&param_1->instance);
  return;
}

Assistant:

HostImpl::ExposedService::ExposedService(ExposedService&&) noexcept = default;